

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedInstancing::Run(AdvancedInstancing *this)

{
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  float *pfVar7;
  CallLogWrapper *pCVar8;
  float *local_400;
  Vector<float,_3> local_390;
  Vector<float,_3> local_384;
  Vector<float,_3> local_378;
  Vector<float,_3> local_36c;
  Vector<float,_3> local_360;
  Vector<float,_3> local_354;
  Vector<float,_3> local_348;
  undefined4 local_33c;
  Vector<float,_3> local_338;
  byte local_32a;
  allocator<tcu::Vector<float,_3>_> local_329;
  undefined1 local_328 [6];
  bool status;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  undefined1 local_2f8 [8];
  Mat4 data_3 [4];
  int data_2 [4];
  uint data_1 [16];
  float data [80];
  char *src_1 [3];
  char *local_48;
  char *src [3];
  char *glsl;
  char *glsl_ver;
  AdvancedInstancing *this_local;
  
  local_48 = "#version 430 core\n";
  src[0] = "#define VS_PASS_THROUGH\n";
  src[1] = 
  "\n#if defined(VS_PASS_THROUGH)\nlayout(location = 0) in vec4 vs_in_position;\nlayout(location = 1) in vec3 vs_in_normal;\nlayout(location = 2) in int vs_in_object_id;\nout StageData {\n  float f;\n  vec3 normal;\n  int object_id;\n} vs_out;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nlayout(binding = 0) uniform samplerBuffer g_transform_buffer;\nmat4 GetTransformMatrix(int id) {\n  return mat4(texelFetch(g_transform_buffer, id * 4),\n              texelFetch(g_transform_buffer, id * 4 + 1),\n              texelFetch(g_transform_buffer, id * 4 + 2),\n              texelFetch(g_transform_buffer, id * 4 + 3));\n}\nvoid main() {\n  gl_Position = GetTransformMatrix(vs_in_object_id) * vs_in_position;\n  vs_out.f = 123.0;\n  vs_out.normal = vs_in_normal;\n  vs_out.object_id = vs_in_object_id;\n}\n#elif defined(FS_SOLID_COLOR)\nin StageData {\n  float f;\n  vec3 normal;\n  flat int object_id;\n} fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  if (fs_in.object_id == 0) g_color = vec4(1, 0, 0, 1);\n  else if (fs_in.object_id == 1) g_color = vec4(0, 1, 0, 1);\n  else if (fs_in.object_id == 2) g_color = vec4(0, 0, 1, 1);\n  else if (fs_in.object_id == 3) g_color = vec4(1, 1, 0, 1);\n}\n#endif"
  ;
  GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b31,3,&local_48);
  this->m_vsp = GVar2;
  data._312_8_ = anon_var_dwarf_1a026a;
  GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b30,3,(GLchar **)(data + 0x4e));
  this->m_fsp = GVar2;
  bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_vsp);
  if (bVar1) {
    bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_fsp);
    if (bVar1) {
      pCVar8 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper;
      glu::CallLogWrapper::glUseProgramStages(pCVar8,this->m_pipeline,1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages(pCVar8,this->m_pipeline,2,this->m_fsp);
      memcpy(data_1 + 0xe,&DAT_02a56760,0x140);
      glu::CallLogWrapper::glBindBuffer(pCVar8,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData(pCVar8,0x8892,0x140,data_1 + 0xe,0x88e4);
      glu::CallLogWrapper::glBindBuffer(pCVar8,0x8892,0);
      data_1[10] = 0;
      data_1[0xb] = 1;
      data_1[0xc] = 2;
      data_1[0xd] = 3;
      data_1[6] = 0;
      data_1[7] = 1;
      data_1[8] = 2;
      data_1[9] = 3;
      data_1[2] = 0;
      data_1[3] = 1;
      data_1[4] = 2;
      data_1[5] = 3;
      data_2[2] = 0;
      data_2[3] = 1;
      data_1[0] = 2;
      data_1[1] = 3;
      glu::CallLogWrapper::glBindBuffer(pCVar8,0x8893,this->m_index_buffer);
      glu::CallLogWrapper::glBufferData(pCVar8,0x8893,0x40,data_2 + 2,0x88e4);
      glu::CallLogWrapper::glBindBuffer(pCVar8,0x8893,0);
      data_3[3].m_data.m_data[3].m_data[2] = 0.0;
      data_3[3].m_data.m_data[3].m_data[3] = 1.4013e-45;
      data_2[0] = 2;
      data_2[1] = 3;
      glu::CallLogWrapper::glBindBuffer(pCVar8,0x8892,this->m_object_id_buffer);
      glu::CallLogWrapper::glBufferData
                (pCVar8,0x8892,0x10,data_3[3].m_data.m_data[3].m_data + 2,0x88e4);
      glu::CallLogWrapper::glBindBuffer(pCVar8,0x8892,0);
      glu::CallLogWrapper::glBindVertexArray(pCVar8,this->m_vertex_array[0]);
      glu::CallLogWrapper::glVertexAttribFormat(pCVar8,0,2,0x1406,'\0',0);
      glu::CallLogWrapper::glVertexAttribFormat(pCVar8,1,3,0x1406,'\0',8);
      glu::CallLogWrapper::glVertexAttribIFormat(pCVar8,2,1,0x1404,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(pCVar8,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(pCVar8,1);
      glu::CallLogWrapper::glEnableVertexAttribArray(pCVar8,2);
      glu::CallLogWrapper::glVertexAttribBinding(pCVar8,1,0);
      glu::CallLogWrapper::glBindVertexBuffer(pCVar8,0,this->m_vertex_buffer,0,0x14);
      glu::CallLogWrapper::glBindVertexBuffer(pCVar8,2,this->m_object_id_buffer,0,4);
      glu::CallLogWrapper::glVertexBindingDivisor(pCVar8,2,1);
      glu::CallLogWrapper::glBindBuffer(pCVar8,0x8893,this->m_index_buffer);
      glu::CallLogWrapper::glBindVertexArray(pCVar8,this->m_vertex_array[1]);
      glu::CallLogWrapper::glVertexAttribFormat(pCVar8,0,2,0x1406,'\0',0);
      glu::CallLogWrapper::glVertexAttribFormat(pCVar8,1,3,0x1406,'\0',0);
      glu::CallLogWrapper::glVertexAttribIFormat(pCVar8,2,1,0x1404,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(pCVar8,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(pCVar8,1);
      glu::CallLogWrapper::glEnableVertexAttribArray(pCVar8,2);
      glu::CallLogWrapper::glVertexAttribBinding(pCVar8,2,0xd);
      glu::CallLogWrapper::glVertexAttribBinding(pCVar8,1,0xe);
      glu::CallLogWrapper::glVertexAttribBinding(pCVar8,0,0xf);
      glu::CallLogWrapper::glBindVertexBuffer(pCVar8,0xf,this->m_vertex_buffer,0,0x14);
      glu::CallLogWrapper::glBindVertexBuffer(pCVar8,0xe,this->m_vertex_buffer,8,0x14);
      glu::CallLogWrapper::glBindVertexBuffer(pCVar8,0xd,this->m_object_id_buffer,0,4);
      glu::CallLogWrapper::glVertexBindingDivisor(pCVar8,0xd,1);
      glu::CallLogWrapper::glBindBuffer(pCVar8,0x8893,this->m_index_buffer);
      glu::CallLogWrapper::glBindVertexArray(pCVar8,0);
      VertexAttribBindingBase::Translation
                ((Mat4 *)local_2f8,&this->super_VertexAttribBindingBase,-0.5,-0.5,0.0);
      VertexAttribBindingBase::Translation
                ((Mat4 *)(data_3[0].m_data.m_data[3].m_data + 2),
                 &this->super_VertexAttribBindingBase,0.5,-0.5,0.0);
      VertexAttribBindingBase::Translation
                ((Mat4 *)(data_3[1].m_data.m_data[3].m_data + 2),
                 &this->super_VertexAttribBindingBase,0.5,0.5,0.0);
      VertexAttribBindingBase::Translation
                ((Mat4 *)(data_3[2].m_data.m_data[3].m_data + 2),
                 &this->super_VertexAttribBindingBase,-0.5,0.5,0.0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2a,this->m_transform_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2a,0x100,local_2f8,0x88e8);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2a,0);
      local_400 = data_3[3].m_data.m_data[3].m_data + 2;
      do {
        local_400 = local_400 + -0x10;
        tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_400);
      } while (local_400 != (float *)local_2f8);
      pCVar8 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper;
      glu::CallLogWrapper::glBindTexture(pCVar8,0x8c2a,this->m_transform_texture);
      glu::CallLogWrapper::glTexBuffer(pCVar8,0x8c2a,0x8814,this->m_transform_buffer);
      glu::CallLogWrapper::glBindTexture(pCVar8,0x8c2a,0);
      glu::CallLogWrapper::glClear(pCVar8,0x4000);
      glu::CallLogWrapper::glBindProgramPipeline(pCVar8,this->m_pipeline);
      glu::CallLogWrapper::glActiveTexture(pCVar8,0x84c0);
      glu::CallLogWrapper::glBindTexture(pCVar8,0x8c2a,this->m_transform_texture);
      glu::CallLogWrapper::glBindVertexArray(pCVar8,this->m_vertex_array[0]);
      iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
      iVar4 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
      std::allocator<tcu::Vector<float,_3>_>::allocator(&local_329);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_328
                 ,(long)(iVar3 * iVar4),&local_329);
      std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_329);
      local_32a = 1;
      glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,4,0x1405,(void *)0x0,1,0,0);
      iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
      iVar4 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
      pvVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_328,0);
      pfVar7 = tcu::Vector<float,_3>::operator[](pvVar6,0);
      glu::CallLogWrapper::glReadPixels
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,iVar3,iVar4,0x1907,0x1406,pfVar7);
      iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
      iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
      iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
      tcu::Vector<float,_3>::Vector(&local_338,1.0,0.0,0.0);
      bVar1 = VertexAttribBindingBase::CheckRectColor
                        (&this->super_VertexAttribBindingBase,
                         (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                         local_328,iVar3,0,0,iVar4,iVar5,&local_338);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_32a = 0;
      }
      if ((local_32a & 1) == 0) {
        this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
      }
      else {
        glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,4,0x1405,(void *)0x10,1,4,1);
        iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
        iVar4 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
        pvVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_328,0);
        pfVar7 = tcu::Vector<float,_3>::operator[](pvVar6,0);
        glu::CallLogWrapper::glReadPixels
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,iVar3,iVar4,0x1907,0x1406,pfVar7);
        iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
        iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
        iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
        tcu::Vector<float,_3>::Vector(&local_348,0.0,1.0,0.0);
        bVar1 = VertexAttribBindingBase::CheckRectColor
                          (&this->super_VertexAttribBindingBase,
                           (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )local_328,iVar3,0,0,iVar4,iVar5,&local_348);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          local_32a = 0;
        }
        if ((local_32a & 1) == 0) {
          this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
        }
        else {
          glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,5,4,0x1405,(void *)0x20,1,8,2);
          iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
          iVar4 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
          pvVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                   operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)local_328,0);
          pfVar7 = tcu::Vector<float,_3>::operator[](pvVar6,0);
          glu::CallLogWrapper::glReadPixels
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,0,iVar3,iVar4,0x1907,0x1406,pfVar7);
          iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
          iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
          iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
          tcu::Vector<float,_3>::Vector(&local_354,0.0,0.0,1.0);
          bVar1 = VertexAttribBindingBase::CheckRectColor
                            (&this->super_VertexAttribBindingBase,
                             (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_328,iVar3,0,0,iVar4,iVar5,&local_354);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            local_32a = 0;
          }
          if ((local_32a & 1) == 0) {
            this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
          }
          else {
            glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,5,4,0x1405,(void *)0x30,1,0xc,3);
            iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
            iVar4 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
            pvVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                     operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 *)local_328,0);
            pfVar7 = tcu::Vector<float,_3>::operator[](pvVar6,0);
            glu::CallLogWrapper::glReadPixels
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0,0,iVar3,iVar4,0x1907,0x1406,pfVar7);
            iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
            iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
            iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase);
            tcu::Vector<float,_3>::Vector(&local_360,1.0,1.0,0.0);
            bVar1 = VertexAttribBindingBase::CheckRectColor
                              (&this->super_VertexAttribBindingBase,
                               (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                *)local_328,iVar3,0,0,iVar4,iVar5,&local_360);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              local_32a = 0;
            }
            if ((local_32a & 1) == 0) {
              this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
            }
            else {
              glu::CallLogWrapper::glBindVertexArray
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,this->m_vertex_array[1]);
              glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,5,4,0x1405,(void *)0x20,1,8,2);
              iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
              iVar4 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase)
              ;
              pvVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                       operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)local_328,0);
              pfVar7 = tcu::Vector<float,_3>::operator[](pvVar6,0);
              glu::CallLogWrapper::glReadPixels
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0,0,iVar3,iVar4,0x1907,0x1406,pfVar7);
              iVar3 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
              iVar4 = VertexAttribBindingBase::getWindowWidth(&this->super_VertexAttribBindingBase);
              iVar5 = VertexAttribBindingBase::getWindowHeight(&this->super_VertexAttribBindingBase)
              ;
              tcu::Vector<float,_3>::Vector(&local_36c,0.0,0.0,1.0);
              bVar1 = VertexAttribBindingBase::CheckRectColor
                                (&this->super_VertexAttribBindingBase,
                                 (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)local_328,iVar3,0,0,iVar4,iVar5,&local_36c);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                local_32a = 0;
              }
              if ((local_32a & 1) == 0) {
                this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
              }
              else {
                glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,5,4,0x1405,(void *)0x0,1,0,0);
                iVar3 = VertexAttribBindingBase::getWindowWidth
                                  (&this->super_VertexAttribBindingBase);
                iVar4 = VertexAttribBindingBase::getWindowHeight
                                  (&this->super_VertexAttribBindingBase);
                pvVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ::operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                       *)local_328,0);
                pfVar7 = tcu::Vector<float,_3>::operator[](pvVar6,0);
                glu::CallLogWrapper::glReadPixels
                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0,0,iVar3,iVar4,0x1907,0x1406,pfVar7);
                iVar3 = VertexAttribBindingBase::getWindowWidth
                                  (&this->super_VertexAttribBindingBase);
                iVar4 = VertexAttribBindingBase::getWindowWidth
                                  (&this->super_VertexAttribBindingBase);
                iVar5 = VertexAttribBindingBase::getWindowHeight
                                  (&this->super_VertexAttribBindingBase);
                tcu::Vector<float,_3>::Vector(&local_378,1.0,0.0,0.0);
                bVar1 = VertexAttribBindingBase::CheckRectColor
                                  (&this->super_VertexAttribBindingBase,
                                   (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                    *)local_328,iVar3,0,0,iVar4,iVar5,&local_378);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  local_32a = 0;
                }
                if ((local_32a & 1) == 0) {
                  this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
                }
                else {
                  glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,5,4,0x1405,(void *)0x10,1,4,1);
                  iVar3 = VertexAttribBindingBase::getWindowWidth
                                    (&this->super_VertexAttribBindingBase);
                  iVar4 = VertexAttribBindingBase::getWindowHeight
                                    (&this->super_VertexAttribBindingBase);
                  pvVar6 = std::
                           vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                           operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                       *)local_328,0);
                  pfVar7 = tcu::Vector<float,_3>::operator[](pvVar6,0);
                  glu::CallLogWrapper::glReadPixels
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,0,0,iVar3,iVar4,0x1907,0x1406,
                             pfVar7);
                  iVar3 = VertexAttribBindingBase::getWindowWidth
                                    (&this->super_VertexAttribBindingBase);
                  iVar4 = VertexAttribBindingBase::getWindowWidth
                                    (&this->super_VertexAttribBindingBase);
                  iVar5 = VertexAttribBindingBase::getWindowHeight
                                    (&this->super_VertexAttribBindingBase);
                  tcu::Vector<float,_3>::Vector(&local_384,0.0,1.0,0.0);
                  bVar1 = VertexAttribBindingBase::CheckRectColor
                                    (&this->super_VertexAttribBindingBase,
                                     (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      *)local_328,iVar3,0,0,iVar4,iVar5,&local_384);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    local_32a = 0;
                  }
                  if ((local_32a & 1) == 0) {
                    this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
                  }
                  else {
                    glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper,5,4,0x1405,(void *)0x30,1,0xc,3
                              );
                    iVar3 = VertexAttribBindingBase::getWindowWidth
                                      (&this->super_VertexAttribBindingBase);
                    iVar4 = VertexAttribBindingBase::getWindowHeight
                                      (&this->super_VertexAttribBindingBase);
                    pvVar6 = std::
                             vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ::operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                           *)local_328,0);
                    pfVar7 = tcu::Vector<float,_3>::operator[](pvVar6,0);
                    glu::CallLogWrapper::glReadPixels
                              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper,0,0,iVar3,iVar4,0x1907,0x1406,
                               pfVar7);
                    iVar3 = VertexAttribBindingBase::getWindowWidth
                                      (&this->super_VertexAttribBindingBase);
                    iVar4 = VertexAttribBindingBase::getWindowWidth
                                      (&this->super_VertexAttribBindingBase);
                    iVar5 = VertexAttribBindingBase::getWindowHeight
                                      (&this->super_VertexAttribBindingBase);
                    tcu::Vector<float,_3>::Vector(&local_390,1.0,1.0,0.0);
                    bVar1 = VertexAttribBindingBase::CheckRectColor
                                      (&this->super_VertexAttribBindingBase,
                                       (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                        *)local_328,iVar3,0,0,iVar4,iVar5,&local_390);
                    if (((bVar1 ^ 0xffU) & 1) != 0) {
                      local_32a = 0;
                    }
                    if ((local_32a & 1) == 0) {
                      this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
                    }
                    else {
                      this_local = (AdvancedInstancing *)0x0;
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_33c = 1;
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_328
                );
    }
    else {
      this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedInstancing *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_ver = "#version 430 core\n";
		const char* const glsl =
			NL "#if defined(VS_PASS_THROUGH)" NL "layout(location = 0) in vec4 vs_in_position;" NL
			   "layout(location = 1) in vec3 vs_in_normal;" NL "layout(location = 2) in int vs_in_object_id;" NL
			   "out StageData {" NL "  float f;" NL "  vec3 normal;" NL "  int object_id;" NL "} vs_out;" NL
			   "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL
			   "layout(binding = 0) uniform samplerBuffer g_transform_buffer;" NL "mat4 GetTransformMatrix(int id) {" NL
			   "  return mat4(texelFetch(g_transform_buffer, id * 4)," NL
			   "              texelFetch(g_transform_buffer, id * 4 + 1)," NL
			   "              texelFetch(g_transform_buffer, id * 4 + 2)," NL
			   "              texelFetch(g_transform_buffer, id * 4 + 3));" NL "}" NL "void main() {" NL
			   "  gl_Position = GetTransformMatrix(vs_in_object_id) * vs_in_position;" NL "  vs_out.f = 123.0;" NL
			   "  vs_out.normal = vs_in_normal;" NL "  vs_out.object_id = vs_in_object_id;" NL "}" NL
			   "#elif defined(FS_SOLID_COLOR)" NL "in StageData {" NL "  float f;" NL "  vec3 normal;" NL
			   "  flat int object_id;" NL "} fs_in;" NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL
			   "  if (fs_in.object_id == 0) g_color = vec4(1, 0, 0, 1);" NL
			   "  else if (fs_in.object_id == 1) g_color = vec4(0, 1, 0, 1);" NL
			   "  else if (fs_in.object_id == 2) g_color = vec4(0, 0, 1, 1);" NL
			   "  else if (fs_in.object_id == 3) g_color = vec4(1, 1, 0, 1);" NL "}" NL "#endif";
		/* VS_PASS_THROUGH */
		{
			const char* const src[] = { glsl_ver, "#define VS_PASS_THROUGH\n", glsl };
			m_vsp					= glCreateShaderProgramv(GL_VERTEX_SHADER, sizeof(src) / sizeof(src[0]), src);
		}
		/* FS_SOLID_COLOR */
		{
			const char* const src[] = { glsl_ver, "#define FS_SOLID_COLOR\n", glsl };
			m_fsp					= glCreateShaderProgramv(GL_FRAGMENT_SHADER, sizeof(src) / sizeof(src[0]), src);
		}
		if (!CheckProgram(m_vsp))
			return ERROR;
		if (!CheckProgram(m_fsp))
			return ERROR;

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);

		{
			const float data[] = { -0.5f, -0.5f, 1.0f,  0.0f, 0.0f,  1.5f,  -0.5f, 1.0f, 0.0f,  0.0f,  -0.5f, 1.5f,
								   1.0f,  0.0f,  0.0f,  1.5f, 1.5f,  1.0f,  0.0f,  0.0f, -1.5f, -0.5f, 0.0f,  1.0f,
								   0.0f,  0.5f,  -0.5f, 0.0f, 1.0f,  0.0f,  -1.5f, 1.5f, 0.0f,  1.0f,  0.0f,  0.5f,
								   1.5f,  0.0f,  1.0f,  0.0f, -1.5f, -1.5f, 0.0f,  0.0f, 1.0f,  0.5f,  -1.5f, 0.0f,
								   0.0f,  1.0f,  -1.5f, 0.5f, 0.0f,  0.0f,  1.0f,  0.5f, 0.5f,  0.0f,  0.0f,  1.0f,
								   -0.5f, -1.5f, 1.0f,  1.0f, 0.0f,  1.5f,  -1.5f, 1.0f, 1.0f,  0.0f,  -0.5f, 0.5f,
								   1.0f,  1.0f,  0.0f,  1.5f, 0.5f,  1.0f,  1.0f,  0.0f };
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		{
			const unsigned int data[] = { 0, 1, 2, 3, 0, 1, 2, 3, 0, 1, 2, 3, 0, 1, 2, 3 };
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		{
			const int data[] = { 0, 1, 2, 3 };
			glBindBuffer(GL_ARRAY_BUFFER, m_object_id_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		glBindVertexArray(m_vertex_array[0]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribIFormat(2, 1, GL_INT, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glVertexAttribBinding(1, 0);
		glBindVertexBuffer(0, m_vertex_buffer, 0, 20);
		glBindVertexBuffer(2, m_object_id_buffer, 0, 4);
		glVertexBindingDivisor(2, 1);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
		glBindVertexArray(m_vertex_array[1]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribIFormat(2, 1, GL_INT, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glVertexAttribBinding(2, 13);
		glVertexAttribBinding(1, 14);
		glVertexAttribBinding(0, 15);
		glBindVertexBuffer(15, m_vertex_buffer, 0, 20);
		glBindVertexBuffer(14, m_vertex_buffer, 8, 20);
		glBindVertexBuffer(13, m_object_id_buffer, 0, 4);
		glVertexBindingDivisor(13, 1);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
		glBindVertexArray(0);

		{
			const Mat4 data[] = { Translation(-0.5f, -0.5f, 0.0f), Translation(0.5f, -0.5f, 0.0f),
								  Translation(0.5f, 0.5f, 0.0f), Translation(-0.5f, 0.5f, 0.0f) };
			glBindBuffer(GL_TEXTURE_BUFFER, m_transform_buffer);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data, GL_DYNAMIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
		}
		glBindTexture(GL_TEXTURE_BUFFER, m_transform_texture);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_transform_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindProgramPipeline(m_pipeline);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_BUFFER, m_transform_texture);
		glBindVertexArray(m_vertex_array[0]);

		std::vector<Vec3> fb(getWindowWidth() * getWindowHeight());
		bool			  status = true;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1, 0, 0);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(1, 0, 0)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(4 * sizeof(unsigned int)), 1, 4, 1);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(8 * sizeof(unsigned int)), 1, 8, 2);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(12 * sizeof(unsigned int)), 1, 12, 3);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(1, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glBindVertexArray(m_vertex_array[1]);

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(8 * sizeof(unsigned int)), 1, 8, 2);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1, 0, 0);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(1, 0, 0)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(4 * sizeof(unsigned int)), 1, 4, 1);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(12 * sizeof(unsigned int)), 1, 12, 3);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(1, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		return NO_ERROR;
	}